

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

QcListEntry * qc_list_enumentry(QcList *list)

{
  QcListEntry *pQVar1;
  
  pQVar1 = list->cur;
  if (pQVar1 != (QcListEntry *)0x0) {
    list->cur = pQVar1->next;
    return pQVar1;
  }
  return (QcListEntry *)0x0;
}

Assistant:

QcListEntry* qc_list_enumentry(QcList *list)
{
    QcListEntry *cur;
    
    cur = list->cur;
    if(cur)
    {
        list->cur = cur->next;
        return cur;
    }

    return NULL;
}